

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoncentralAbsoluteAdapter.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::NoncentralAbsoluteAdapter::NoncentralAbsoluteAdapter
          (NoncentralAbsoluteAdapter *this,bearingVectors_t *bearingVectors,
          camCorrespondences_t *camCorrespondences,points_t *points,translations_t *camOffsets,
          rotations_t *camRotations)

{
  AbsoluteAdapterBase::AbsoluteAdapterBase(&this->super_AbsoluteAdapterBase);
  (this->super_AbsoluteAdapterBase)._vptr_AbsoluteAdapterBase =
       (_func_int **)&PTR__NoncentralAbsoluteAdapter_002c3c10;
  this->_bearingVectors = bearingVectors;
  this->_camCorrespondences = camCorrespondences;
  this->_points = points;
  this->_camOffsets = camOffsets;
  this->_camRotations = camRotations;
  return;
}

Assistant:

opengv::absolute_pose::NoncentralAbsoluteAdapter::NoncentralAbsoluteAdapter(
    const bearingVectors_t & bearingVectors,
    const camCorrespondences_t & camCorrespondences,
    const points_t & points,
    const translations_t & camOffsets,
    const rotations_t & camRotations ) :
    AbsoluteAdapterBase(),
    _bearingVectors(bearingVectors),
    _camCorrespondences(camCorrespondences),
    _points(points),
    _camOffsets(camOffsets),
    _camRotations(camRotations)
{}